

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O0

void time_fuc_engine_watchdog(uint card,char *fuc_engine_name,u32 fucengine)

{
  uint32_t val_00;
  uint32_t val_01;
  uint32_t uVar1;
  ulong uVar2;
  ptime_t pVar3;
  undefined1 auVar4 [16];
  bool local_61;
  ptime_t val;
  u32 r38;
  u32 r34;
  int i;
  float freq;
  ptime_t t_start;
  timeval end;
  timeval start;
  u32 fucengine_local;
  char *fuc_engine_name_local;
  uint card_local;
  
  r38 = 0;
  val_00 = nva_rd32(card,fucengine + 0x34);
  val_01 = nva_rd32(card,fucengine + 0x38);
  nva_wr32(card,fucengine + 0x38,1);
  nva_wr32(card,fucengine + 0x34,0xffffffff);
  do {
    uVar1 = nva_rd32(card,fucengine + 0x34);
    uVar2 = (ulong)uVar1;
    r38 = r38 + 1;
    local_61 = uVar2 < 10000000 && (int)r38 < 10000;
  } while (local_61);
  if (((int)r38 < 10000) && ((uVar2 & 0xffff0000) != 0xbadf0000)) {
    gettimeofday((timeval *)&end.tv_usec,(__timezone_ptr_t)0x0);
    do {
      uVar1 = nva_rd32(card,fucengine + 0x34);
    } while (uVar2 - uVar1 < 10000000);
    gettimeofday((timeval *)&t_start,(__timezone_ptr_t)0x0);
    pVar3 = time_diff_us(stack0xffffffffffffffd0,_t_start);
    auVar4._8_4_ = (int)(pVar3 >> 0x20);
    auVar4._0_8_ = pVar3;
    auVar4._12_4_ = 0x45300000;
    r34 = (u32)(float)(10000000.0 /
                      ((auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)pVar3) - 4503599627370496.0)));
  }
  else {
    r34 = 0;
  }
  printf("%s\'s watchdog: frequency       = %f MHz\n",(double)(float)r34,fuc_engine_name);
  nva_wr32(card,fucengine + 0x38,val_01);
  nva_wr32(card,fucengine + 0x34,val_00);
  return;
}

Assistant:

void time_fuc_engine_watchdog (unsigned int card, const char *fuc_engine_name, u32 fucengine)
{
	struct timeval start, end;
	ptime_t t_start;
	float freq;
	int i = 0;

	/* Save the current values */
	u32 r34 = nva_rd32(card, fucengine + 0x34);
	u32 r38 = nva_rd32(card, fucengine + 0x38);

	nva_wr32(card, fucengine + 0x38, 0x1);
	nva_wr32(card, fucengine + 0x34, 0xffffffff);
	do
	{
		t_start = nva_rd32(card, fucengine + 0x34);
		i++;
	} while (t_start < 10000000 && i < 10000);

	if (i < 10000 && ((t_start & 0xffff0000) != 0xbadf0000)) {
		gettimeofday(&start, NULL);

		while (t_start - nva_rd32(card, fucengine + 0x34) < 10000000);

		gettimeofday(&end, NULL);

		ptime_t val = time_diff_us(start, end);
		freq = 10000000.0 / val;
	} else {
		freq = 0;
	}
	printf("%s's watchdog: frequency       = %f MHz\n", fuc_engine_name, freq);

	/* Restore the previous values */
	nva_wr32(card, fucengine + 0x38, r38);
	nva_wr32(card, fucengine + 0x34, r34);
}